

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

Int64FeatureType * __thiscall
CoreML::Specification::Int64FeatureType::New(Int64FeatureType *this,Arena *arena)

{
  Int64FeatureType *this_00;
  Int64FeatureType *n;
  Arena *arena_local;
  Int64FeatureType *this_local;
  
  this_00 = (Int64FeatureType *)operator_new(0x18);
  Int64FeatureType(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::Int64FeatureType>(arena,this_00);
  }
  return this_00;
}

Assistant:

Int64FeatureType* Int64FeatureType::New(::google::protobuf::Arena* arena) const {
  Int64FeatureType* n = new Int64FeatureType;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}